

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void to_utf16_test(void)

{
  ostream *poVar1;
  allocator<char> local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string s;
  
  print_utf16(0x41);
  print_utf16(0xf7);
  print_utf16(0x3c0);
  print_utf16(0x16059);
  print_utf16(0xdead);
  print_utf16(0x7fffffff);
  print_utf16(0x80000000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,anon_var_dwarf_4ba5 + 5,(allocator<char> *)&local_48);
  QUtil::utf8_to_utf16(&s,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  QUtil::utf16_to_utf8(&local_68,&s);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_48,&s,".");
  QUtil::utf16_to_utf8(&local_68,&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"LE: ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_4a6d,&local_69);
  QUtil::utf16_to_utf8(&local_68,&local_48);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void
to_utf16_test()
{
    print_utf16(0x41UL);
    print_utf16(0xF7UL);
    print_utf16(0x3c0UL);
    print_utf16(0x16059UL);
    print_utf16(0xdeadUL);
    print_utf16(0x7fffffffUL);
    print_utf16(0x80000000UL);

    std::string s(QUtil::utf8_to_utf16("\xcf\x80"));
    std::cout << QUtil::utf16_to_utf8(s) << std::endl;
    std::cout << QUtil::utf16_to_utf8(s + ".") << std::endl;
    std::cout << "LE: " << QUtil::utf16_to_utf8("\xff\xfe\xc0\x03") << std::endl;
}